

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::SetAllPropertiesToUndefined
          (PathTypeHandlerBase *this,DynamicObject *instance,bool invalidateFixedFields)

{
  uint16 uVar1;
  PropertyId propertyId_00;
  ScriptContext *scriptContext_00;
  TypePath *this_00;
  PropertyRecord *this_01;
  JavascriptLibrary *this_02;
  RecyclableObject *value;
  undefined2 local_3a;
  PropertyIndex propertyIndex_1;
  RecyclableObject *undefined;
  PropertyId propertyId;
  PropertyIndex propertyIndex;
  ScriptContext *scriptContext;
  int propertyCount;
  bool invalidateFixedFields_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  uVar1 = GetPathLength(this);
  if (invalidateFixedFields) {
    scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    for (undefined._6_2_ = 0; undefined._6_2_ < uVar1; undefined._6_2_ = undefined._6_2_ + 1) {
      this_00 = GetTypePath(this);
      this_01 = TypePath::GetPropertyIdUnchecked(this_00,(uint)undefined._6_2_);
      propertyId_00 = PropertyRecord::GetPropertyId(this_01);
      InvalidateFixedFieldAt(this,propertyId_00,undefined._6_2_,scriptContext_00);
    }
  }
  this_02 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
  value = JavascriptLibraryBase::GetUndefined(&this_02->super_JavascriptLibraryBase);
  for (local_3a = 0; local_3a < uVar1; local_3a = local_3a + 1) {
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)local_3a,value);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = GetPathLength();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            Js::ScriptContext* scriptContext = instance->GetScriptContext();
            for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                PropertyId propertyId = this->GetTypePath()->GetPropertyIdUnchecked(propertyIndex)->GetPropertyId();
                InvalidateFixedFieldAt(propertyId, propertyIndex, scriptContext);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, undefined);
        }

    }